

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_disp_mgr.c
# Opt level: O0

void * ihevc_disp_mgr_get(disp_mgr_t *ps_disp_mgr,WORD32 *pi4_buf_id)

{
  WORD32 min_poc_id;
  WORD32 i4_min_poc;
  void *pv_ret_ptr;
  WORD32 id;
  WORD32 *pi4_buf_id_local;
  disp_mgr_t *ps_disp_mgr_local;
  void *local_8;
  
  i4_min_poc = 0x7fffffff;
  min_poc_id = -1;
  for (id = 0; id < 0x40; id = id + 1) {
    if ((ps_disp_mgr->ai4_abs_poc[id] != 0x7fffffff) && (ps_disp_mgr->ai4_abs_poc[id] <= i4_min_poc)
       ) {
      i4_min_poc = ps_disp_mgr->ai4_abs_poc[id];
      min_poc_id = id;
    }
  }
  *pi4_buf_id = min_poc_id;
  if (min_poc_id == -1) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = ps_disp_mgr->apv_ptr[min_poc_id];
    ps_disp_mgr->apv_ptr[min_poc_id] = (void *)0x0;
    ps_disp_mgr->ai4_abs_poc[min_poc_id] = 0x7fffffff;
  }
  return local_8;
}

Assistant:

void* ihevc_disp_mgr_get(
                disp_mgr_t *ps_disp_mgr,
                WORD32 *pi4_buf_id)
{
    WORD32 id;
    void *pv_ret_ptr;
    WORD32 i4_min_poc;
    WORD32 min_poc_id;


    pv_ret_ptr = NULL;
    i4_min_poc = 0x7FFFFFFF;
    min_poc_id = -1;

    /* Find minimum POC */
    for(id = 0; id < DISP_MGR_MAX_CNT; id++)
    {
        if((DEFAULT_POC != ps_disp_mgr->ai4_abs_poc[id]) &&
                        (ps_disp_mgr->ai4_abs_poc[id] <= i4_min_poc))
        {
            i4_min_poc = ps_disp_mgr->ai4_abs_poc[id];
            min_poc_id = id;
        }
    }
    *pi4_buf_id = min_poc_id;
    /* If all pocs are still default_poc then return NULL */
    if(-1 == min_poc_id)
    {
        return NULL;
    }

    pv_ret_ptr = ps_disp_mgr->apv_ptr[min_poc_id];

    /* Set abs poc to default and apv_ptr to null so that the buffer is not returned again */
    ps_disp_mgr->apv_ptr[min_poc_id] = NULL;
    ps_disp_mgr->ai4_abs_poc[min_poc_id] = DEFAULT_POC;
    return pv_ret_ptr;
}